

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int __thiscall
ON_Mesh::GetVertexEdges
          (ON_Mesh *this,int vertex_index_count,int *vertex_index,bool bNoDuplicates,
          ON_SimpleArray<ON_2dex> *edges)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ON_MeshFace *pOVar5;
  ON_MeshTopologyEdge *pOVar6;
  ON_2dex *pOVar7;
  ulong size;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int *piVar13;
  ON_MeshTopologyVertex *pOVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ON_MeshFace *pOVar20;
  long lVar21;
  long lVar22;
  ON_2dex edge_ends;
  int *local_98;
  ON_Workspace ws;
  
  uVar12 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  iVar8 = 0;
  iVar11 = 0;
  if (((2 < (int)uVar12) && (iVar11 = iVar8, 0 < vertex_index_count)) &&
     (vertex_index != (int *)0x0)) {
    uVar10 = (this->m_F).m_count;
    if (0 < (int)uVar10) {
      uVar1 = edges->m_count;
      pOVar5 = (this->m_F).m_a;
      size = (ulong)(uint)vertex_index_count;
      if ((((this->m_top).m_b32IsValid == 1) && (uVar12 == (this->m_top).m_topv_map.m_count)) &&
         (uVar19 = (this->m_top).m_tope.m_count, 0 < (int)uVar19)) {
        piVar13 = (this->m_top).m_topv_map.m_a;
        iVar11 = (this->m_top).m_topv.m_count;
        for (uVar15 = 0; uVar15 != size; uVar15 = uVar15 + 1) {
          uVar9 = vertex_index[uVar15];
          if (uVar9 < uVar12) {
            iVar8 = piVar13[uVar9];
            if ((-1 < (long)iVar8) && (iVar8 <= iVar11)) {
              edge_ends.i = uVar9;
              pOVar14 = (this->m_top).m_topv.m_a + iVar8;
              for (lVar16 = 0; lVar16 < pOVar14->m_tope_count; lVar16 = lVar16 + 1) {
                uVar2 = pOVar14->m_topei[lVar16];
                if (uVar2 < uVar19) {
                  pOVar6 = (this->m_top).m_tope.m_a;
                  for (lVar22 = 0; lVar17 = 3, lVar22 < pOVar6[uVar2].m_topf_count;
                      lVar22 = lVar22 + 1) {
                    uVar3 = pOVar6[uVar2].m_topfi[lVar22];
                    if (uVar3 < uVar10) {
                      for (; lVar17 != 7; lVar17 = lVar17 + 1) {
                        if (pOVar5[uVar3].vi[lVar17 + -3] == uVar9) {
                          uVar4 = pOVar5[uVar3].vi[(uint)lVar17 & 3];
                          if (uVar9 != uVar4 && uVar4 < uVar12) {
                            edge_ends.j = uVar9;
                            edge_ends.i = uVar4;
                            ON_SimpleArray<ON_2dex>::Append(edges,&edge_ends);
                          }
                          if ((lVar17 == 5) && (pOVar5[uVar3].vi[2] == pOVar5[uVar3].vi[3])) {
                            uVar18 = 0;
                          }
                          else {
                            uVar18 = (ulong)((uint)lVar17 - 2 & 3);
                          }
                          uVar3 = pOVar5[uVar3].vi[uVar18];
                          if (uVar9 != uVar3 && uVar3 < uVar12) {
                            edge_ends.j = uVar3;
                            edge_ends.i = uVar9;
                            ON_SimpleArray<ON_2dex>::Append(edges,&edge_ends);
                          }
                          break;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        ON_Workspace::ON_Workspace(&ws);
        uVar15 = 1;
        do {
          local_98 = vertex_index;
          if (size <= uVar15) goto LAB_00516833;
          piVar13 = vertex_index + uVar15;
          lVar16 = uVar15 - 1;
          uVar15 = uVar15 + 1;
        } while (vertex_index[lVar16] <= *piVar13);
        local_98 = ON_Workspace::GetIntMemory(&ws,size);
        memcpy(local_98,vertex_index,size * 4);
        ON_SortIntArray(quick_sort,local_98,size);
LAB_00516833:
        pOVar20 = pOVar5;
        for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
          for (lVar16 = 3; lVar16 != 7; lVar16 = lVar16 + 1) {
            uVar19 = pOVar20->vi[lVar16 + -3];
            piVar13 = ON_BinarySearchIntArray(uVar19,local_98,size);
            if (piVar13 != (int *)0x0) {
              uVar9 = pOVar5[uVar15].vi[(uint)lVar16 & 3];
              if ((uVar9 < uVar12) && (uVar19 != uVar9)) {
                edge_ends.j = uVar19;
                edge_ends.i = uVar9;
                ON_SimpleArray<ON_2dex>::Append(edges,&edge_ends);
              }
              if ((lVar16 == 5) && (pOVar5[uVar15].vi[2] == pOVar5[uVar15].vi[3])) {
                uVar9 = 0;
              }
              else {
                uVar9 = (uint)lVar16 - 2 & 3;
              }
              uVar9 = pOVar5[uVar15].vi[uVar9];
              if ((uVar9 < uVar12) && (uVar19 != uVar9)) {
                edge_ends.j = uVar9;
                edge_ends.i = uVar19;
                ON_SimpleArray<ON_2dex>::Append(edges,&edge_ends);
              }
            }
          }
          pOVar20 = pOVar20 + 1;
        }
        ON_Workspace::~ON_Workspace(&ws);
      }
      uVar12 = edges->m_count;
      if ((int)uVar1 < (int)uVar12 && bNoDuplicates) {
        lVar22 = (long)(int)uVar1;
        for (lVar16 = lVar22; pOVar7 = edges->m_a, lVar16 < (int)uVar12; lVar16 = lVar16 + 1) {
          edge_ends = pOVar7[lVar16];
          iVar11 = edge_ends.j;
          if (iVar11 < edge_ends.i) {
            edge_ends.j = edge_ends.i;
            edge_ends.i = iVar11;
            pOVar7[lVar16] = edge_ends;
            uVar12 = edges->m_count;
          }
        }
        ON_qsort(pOVar7 + lVar22,(long)(int)(uVar12 - uVar1),8,ON_MeshGetVertexEdges_Compare2dex);
        edge_ends = edges->m_a[lVar22];
        uVar10 = ~uVar1;
        uVar19 = uVar1;
        do {
          uVar9 = uVar19 + 1;
          lVar21 = 0;
          lVar16 = lVar22 * 8;
          lVar17 = lVar22;
          do {
            lVar17 = lVar17 + 1;
            uVar12 = edges->m_count;
            if ((int)uVar12 <= lVar17) {
              if ((-2 < (int)uVar19) && ((int)uVar19 < edges->m_capacity)) {
                edges->m_count = uVar9;
                uVar12 = uVar9;
              }
              goto LAB_00516a49;
            }
            iVar11 = ON_Compare2dex(&edge_ends,(ON_2dex *)((long)&edges->m_a[1].i + lVar16));
            lVar21 = lVar21 + -1;
            lVar16 = lVar16 + 8;
          } while (iVar11 == 0);
          edge_ends = edges->m_a[lVar17];
          if ((int)lVar22 + uVar10 != (int)lVar21) {
            edges->m_a[(int)uVar9] = edge_ends;
          }
          lVar22 = lVar22 - lVar21;
          uVar10 = uVar10 - 1;
          uVar19 = uVar9;
        } while( true );
      }
LAB_00516a49:
      iVar11 = uVar12 - uVar1;
    }
  }
  return iVar11;
}

Assistant:

int ON_Mesh::GetVertexEdges( 
  int vertex_index_count,
  const int* vertex_index, 
  bool bNoDuplicates,
  ON_SimpleArray<ON_2dex>& edges
  ) const
{
  // Get edges connected to vertices in vertex_index[] array.
  const int edges_count0 = edges.Count();

  const int mesh_vcount = m_V.Count();

  //03/12/2007 TimH. The line below appears to be a typo.  Using the following line works better.
  //const int mesh_fcount = m_V.Count();
  const int mesh_fcount = m_F.Count();

  if (   vertex_index_count <= 0 || 0 == vertex_index 
      || mesh_fcount <= 0 || mesh_vcount < 3 )
  {
    return 0;
  }

  int vei, efi, fvi, ei, fi, j, n, vi;
  const int* f_vi;
  ON_2dex edge_ends;
  const ON_MeshFace* f = m_F.Array();

  if (   TopologyExists()
       && mesh_vcount == m_top.m_topv_map.Count()
       && m_top.m_tope.Count() > 0 )
  {
    // Topology looks good; use it to speed up the search.
    const int* topv_map = m_top.m_topv_map;
    const int top_vcount = m_top.m_topv.Count();
    const int top_ecount = m_top.m_tope.Count();
    int top_vi;
    for ( n = 0; n < vertex_index_count; n++ )
    {
      vi = vertex_index[n];
      if ( vi < 0 || vi >= mesh_vcount )
        continue;
      top_vi = topv_map[vi];
      if ( top_vi < 0 || top_vi > top_vcount )
        continue;
      edge_ends.i = vi;
      const ON_MeshTopologyVertex& v = m_top.m_topv[top_vi];
      for ( vei = 0; vei < v.m_tope_count; vei++ )
      {
        ei = v.m_topei[vei];
        if ( ei < 0 || ei >= top_ecount )
          continue;
        const ON_MeshTopologyEdge& e = m_top.m_tope[ei];
        for ( efi = 0; efi < e.m_topf_count; efi++ )
        {
          fi = e.m_topfi[efi];
          if ( fi < 0 || fi >= mesh_fcount )
            continue;
          f_vi = f[fi].vi;
          for ( fvi = 0; fvi < 4; fvi++ )
          {
            if ( f_vi[fvi] == vi )
            {
              j = f_vi[(fvi+3)%4];
              if ( j >= 0 && j < mesh_vcount && vi != j )
              {
                edge_ends.i = j;
                edge_ends.j = vi;
                edges.Append(edge_ends);
              }
              j = f_vi[ (2==fvi && f_vi[2]==f_vi[3]) ? 0 : ((fvi+1)%4) ];
              if ( j >= 0 && j < mesh_vcount && vi != j )
              {
                edge_ends.i = vi;
                edge_ends.j = j;
                edges.Append(edge_ends);
              }
              break; // done with this face
            }
          }
        }
      }
    }
  }
  else
  {
    // slow-n-stupid search through all the faces

    // Sort vertex_index[] array so we can use a quick
    // binary search to see if a face is using one of 
    // the vertices in the list.
    ON_Workspace ws;
    for ( vi = 1; vi < vertex_index_count; vi++ )
    {
      if ( vertex_index[vi] < vertex_index[vi-1] )
      {
        // need to sort vertex_index[] array
        int* tmp = ws.GetIntMemory(vertex_index_count);
        memcpy(tmp,vertex_index,vertex_index_count*sizeof(tmp[0]));
        ON_SortIntArray(ON::sort_algorithm::quick_sort,tmp,vertex_index_count);
        vertex_index = tmp;
        break;
      }
    }

    // Find all the faces that use a vertex in the vertex_index[] array.
    for ( fi = 0; fi < mesh_fcount; fi++ )
    {
      f_vi = f[fi].vi;
      for ( fvi = 0; fvi < 4; fvi++ )
      {
        vi = f_vi[fvi];
        if ( ON_BinarySearchIntArray(vi,vertex_index,vertex_index_count) )
        {
          // vi is in the vertex_index[] array.  Add the edges
          // of this face that begin and end at this vertex.
          j = f_vi[(fvi+3)%4];
          if ( j >= 0 && j < mesh_vcount && vi != j )
          {
            edge_ends.i = j;
            edge_ends.j = vi;
            edges.Append(edge_ends);
          }
          j = f_vi[ (2==fvi && f_vi[2]==f_vi[3]) ? 0 : ((fvi+1)%4) ];
          if ( j >= 0 && j < mesh_vcount && vi != j )
          {
            edge_ends.i = vi;
            edge_ends.j = j;
            edges.Append(edge_ends);
          }
        }
      }
    }
  }

  if ( bNoDuplicates && edges.Count() > edges_count0 )
  {
    for ( ei = edges_count0; ei < edges.Count(); ei++ )
    {
      edge_ends = edges[ei];
      if ( edge_ends.i > edge_ends.j )
      {
        j = edge_ends.i; edge_ends.i = edge_ends.j; edge_ends.j = j;
        edges[ei] = edge_ends;
      }
    }
    ON_qsort( edges.Array() + edges_count0,
              edges.Count() - edges_count0,
              sizeof(edge_ends), 
              ON_MeshGetVertexEdges_Compare2dex);
    edge_ends = edges[edges_count0];
    for ( ei = j = edges_count0+1; ei < edges.Count(); ei++ )
    {
      if ( ON_Compare2dex(&edge_ends,&edges[ei]) )
      {
        edge_ends = edges[ei];
        if ( j != ei )
          edges[j] = edge_ends;
        j++;
      }
    }
    edges.SetCount(j);
  }

  return (edges.Count() - edges_count0);
}